

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

shared_ptr<chatra::Node> __thiscall
chatra::
parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
          (chatra *this,ParserContext *ct,
          __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
          first,__normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                last)

{
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  first_00;
  pointer *pppTVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TokenType TVar3;
  int iVar4;
  Token *pTVar5;
  iterator iVar6;
  element_type *peVar7;
  OperatorPattern *pOVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  pointer ppTVar10;
  long lVar11;
  bool bVar12;
  undefined1 auVar13 [8];
  undefined1 auVar14 [8];
  undefined1 auVar15 [8];
  char *pcVar16;
  pointer psVar17;
  shared_ptr<chatra::Node> *psVar18;
  long lVar19;
  iterator iVar20;
  iterator it;
  pointer psVar21;
  element_type *extraout_RAX;
  int iVar22;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  last_00;
  ulong uVar23;
  char *pcVar24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined1 auVar25 [8];
  byte bVar26;
  OperatorPattern *pattern;
  Token **ppTVar27;
  OperatorPattern *pOVar28;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  __args;
  shared_ptr<chatra::Node> sVar29;
  element_type *peStack_98;
  size_type __dnew;
  pointer local_88;
  char *local_80;
  undefined1 auStack_78 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> nodes;
  undefined1 auStack_58 [8];
  shared_ptr<chatra::Node> n;
  
  auStack_78 = (undefined1  [8])0x0;
  nodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __args._M_current = first._M_current;
  if (first._M_current == last._M_current) {
    auVar25 = (undefined1  [8])0x0;
  }
  else {
    do {
      pTVar5 = *__args._M_current;
      TVar3 = pTVar5->type;
      if ((TVar3 != Number) && (TVar3 != String)) {
        if (TVar3 == OpenBracket) {
          auStack_58 = (undefined1  [8])0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          psVar18 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                              ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                *)auStack_78,(shared_ptr<chatra::Line> *)auStack_58,Unknown);
          if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          first_00._M_current = __args._M_current + 1;
          if (first_00._M_current == last._M_current) {
            local_80 = (char *)CONCAT71(local_80._1_7_,1);
            last_00._M_current = first_00._M_current;
          }
          else {
            lVar19 = 8;
            iVar22 = 0;
            do {
              iVar4 = *(int *)(*(long *)((long)__args._M_current + lVar19) + 0x28);
              if (iVar4 == 6) {
                if (iVar22 == 0) break;
                iVar22 = iVar22 + -1;
              }
              else if (iVar4 == 5) {
                iVar22 = iVar22 + 1;
              }
              lVar11 = lVar19 + 8;
              lVar19 = lVar19 + 8;
            } while (__args._M_current + lVar11 != last._M_current);
            local_80 = (char *)CONCAT71(local_80._1_7_,lVar19 == 8);
            last_00._M_current = __args._M_current + lVar19;
          }
          peVar7 = (psVar18->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          ppTVar27 = last_00._M_current + 1;
          std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                    ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)
                     &peVar7->tokens,
                     (peVar7->tokens).
                     super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__args._M_current);
          peVar7 = (psVar18->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          if ((char)local_80 == '\0') {
            parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                      ((chatra *)auStack_58,ct,first_00,last_00);
          }
          else {
            auStack_58 = (undefined1  [8])0x0;
            n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
          }
          std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
          emplace_back<std::shared_ptr<chatra::Node>>
                    ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                      *)&peVar7->subNodes,(shared_ptr<chatra::Node> *)auStack_58);
          if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          goto LAB_0019cd16;
        }
        if (pTVar5->sid - Null < 3) goto LAB_0019cce7;
        if (TVar3 == Operator) {
          auStack_58 = (undefined1  [8])0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          psVar18 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                              ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                *)auStack_78,(shared_ptr<chatra::Line> *)auStack_58,Unknown);
          peVar7 = (psVar18->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          iVar6._M_current =
               (peVar7->tokens).
               super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (peVar7->tokens).
              super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
            _M_realloc_insert<chatra::Token_const*const&>
                      ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)
                       &peVar7->tokens,iVar6,__args._M_current);
          }
          else {
            *iVar6._M_current = *__args._M_current;
            pppTVar1 = &(peVar7->tokens).
                        super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppTVar1 = *pppTVar1 + 1;
          }
          goto LAB_0019cd01;
        }
        if (TVar3 == Name) {
          auStack_58 = (undefined1  [8])0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          psVar18 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                              ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                *)auStack_78,(shared_ptr<chatra::Line> *)auStack_58,Name);
          if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          pTVar5 = *__args._M_current;
          peVar7 = (psVar18->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          peVar7->sid = pTVar5->sid;
          ppTVar27 = __args._M_current + 1;
          iVar6._M_current =
               (peVar7->tokens).
               super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (peVar7->tokens).
              super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
            _M_realloc_insert<chatra::Token_const*const&>
                      ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)
                       &peVar7->tokens,iVar6,__args._M_current);
          }
          else {
            *iVar6._M_current = pTVar5;
            pppTVar1 = &(peVar7->tokens).
                        super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppTVar1 = *pppTVar1 + 1;
          }
          goto LAB_0019cd16;
        }
        p_Var2 = &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        peStack_98 = (element_type *)0x13;
        auStack_58 = (undefined1  [8])p_Var2;
        auStack_58 = (undefined1  [8])
                     std::__cxx11::string::_M_create
                               ((ulong *)auStack_58,(ulong)&stack0xffffffffffffff68);
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_98;
        ((element_type *)auStack_58)->type = 'e';
        ((element_type *)auStack_58)->field_0x1 = 'x';
        ((element_type *)auStack_58)->field_0x2 = 'p';
        ((element_type *)auStack_58)->field_0x3 = 'e';
        ((element_type *)auStack_58)->field_0x4 = 'c';
        ((element_type *)auStack_58)->field_0x5 = 't';
        ((element_type *)auStack_58)->field_0x6 = 'e';
        ((element_type *)auStack_58)->field_0x7 = 'd';
        (((element_type *)auStack_58)->line).
        super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x7373657270786520;
        *(undefined4 *)
         ((long)&(((element_type *)auStack_58)->line).
                 super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 7) =
             0x6e6f6973;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_98;
        (&peStack_98->type)[(long)&((element_type *)auStack_58)->type] = Unknown;
        peStack_98 = (element_type *)0x0;
        __dnew = 0;
        local_88 = (pointer)0x0;
        ParserContext::errorAtToken
                  (ct,Error,pTVar5,(string *)auStack_58,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffff68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffff68);
        auVar13 = auStack_78;
        auVar14 = auStack_78;
        auVar15 = (undefined1  [8])
                  nodes.
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar21 = nodes.
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (auStack_58 != (undefined1  [8])p_Var2) {
          operator_delete((void *)auStack_58);
          auVar13 = auStack_78;
          auVar14 = auStack_78;
          auVar15 = (undefined1  [8])
                    nodes.
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar21 = nodes.
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; psVar17 = nodes.
                         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, auVar25 = auStack_78,
            bVar12 = (undefined1  [8])
                     nodes.
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != auVar13, auStack_78 = auVar14,
            nodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar15, bVar12;
            auVar13 = (undefined1  [8])((long)auVar13 + 0x10)) {
          p_Var9 = (((shared_ptr<chatra::Node> *)auVar13)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          nodes.
          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_start = psVar21;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
          auVar14 = auStack_78;
          auVar15 = auVar25;
          psVar21 = nodes.
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          nodes.
          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_start = psVar17;
          auStack_78 = auVar25;
        }
        break;
      }
LAB_0019cce7:
      parseAsLiteral((ParserContext *)auStack_58,(Token *)ct);
      std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
      emplace_back<std::shared_ptr<chatra::Node>>
                ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                  *)auStack_78,(shared_ptr<chatra::Node> *)auStack_58);
LAB_0019cd01:
      if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      ppTVar27 = __args._M_current + 1;
LAB_0019cd16:
      auVar25 = (undefined1  [8])
                nodes.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __args._M_current = ppTVar27;
    } while (ppTVar27 != last._M_current);
  }
  pcVar16 = DAT_002554f0;
  if (auStack_78 != auVar25) {
    if (opPatterns != DAT_002554f0) {
      pcVar24 = opPatterns;
      do {
        psVar21 = nodes.
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        auVar25 = auStack_78;
        iVar20._M_current =
             nodes.
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        it._M_current = (shared_ptr<chatra::Node> *)auStack_78;
        local_80 = pcVar24;
        if (*pcVar24 == '\x01') {
          for (; it._M_current != psVar21;
              it._M_current =
                   (shared_ptr<chatra::Node> *)
                   ((long)&((it._M_current)->
                           super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                   uVar23)) {
            pOVar28 = *(OperatorPattern **)(pcVar24 + 8);
            pOVar8 = *(OperatorPattern **)(pcVar24 + 0x10);
            if (pOVar28 == pOVar8) {
              uVar23 = 0x10;
            }
            else {
              bVar26 = 0;
              do {
                if ((ulong)((long)(pOVar28->elements).
                                  super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pOVar28->elements).
                                 super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                 ._M_impl.super__Vector_impl_data._M_start) <=
                    (ulong)((long)nodes.
                                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)it._M_current))
                {
                  extractOperator<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                            ((chatra *)auStack_58,
                             (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                              )auStack_78,
                             (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                              )it._M_current,pOVar28);
                  if (auStack_58 != (undefined1  [8])0x0) {
                    iVar20 = std::
                             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             ::_M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                         *)auStack_78,it,
                                        (shared_ptr<chatra::Node> *)
                                        (((long)(pOVar28->elements).
                                                super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pOVar28->elements).
                                               super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                               ._M_impl.super__Vector_impl_data._M_start) +
                                        (long)it._M_current));
                    it = std::
                         vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ::insert((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                   *)auStack_78,(const_iterator)iVar20._M_current,
                                  (value_type *)auStack_58);
                    bVar26 = 1;
                  }
                  if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              );
                  }
                }
                pOVar28 = pOVar28 + 1;
              } while (pOVar28 != pOVar8);
              uVar23 = (ulong)(((byte)~bVar26 & 1) << 4);
              psVar21 = nodes.
                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar24 = local_80;
            }
          }
        }
        else {
          for (; (undefined1  [8])iVar20._M_current != auVar25;
              iVar20._M_current =
                   (shared_ptr<chatra::Node> *)
                   ((long)&((iVar20._M_current)->
                           super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                   lVar19)) {
            pOVar28 = *(OperatorPattern **)(pcVar24 + 8);
            pOVar8 = *(OperatorPattern **)(pcVar24 + 0x10);
            if (pOVar28 == pOVar8) {
              lVar19 = -0x10;
            }
            else {
              iVar22 = 0;
              do {
                uVar23 = (long)(pOVar28->elements).
                               super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pOVar28->elements).
                               super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                if (uVar23 <= (ulong)((long)iVar20._M_current - (long)auStack_78)) {
                  extractOperator<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                            ((chatra *)auStack_58,
                             (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                              )auStack_78,
                             (shared_ptr<chatra::Node> *)((long)iVar20._M_current - uVar23),pOVar28)
                  ;
                  if (auStack_58 != (undefined1  [8])0x0) {
                    iVar20 = std::
                             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             ::_M_erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                         *)auStack_78,
                                        (shared_ptr<chatra::Node> *)
                                        (((long)(pOVar28->elements).
                                                super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                                ._M_impl.super__Vector_impl_data._M_start -
                                         (long)(pOVar28->elements).
                                               super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                               ._M_impl.super__Vector_impl_data._M_finish) +
                                        (long)iVar20._M_current),iVar20);
                    iVar20 = std::
                             vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             ::insert((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                       *)auStack_78,(const_iterator)iVar20._M_current,
                                      (value_type *)auStack_58);
                    iVar20._M_current = iVar20._M_current + 1;
                    iVar22 = 1;
                  }
                  if (n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                      (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              );
                  }
                }
                pOVar28 = pOVar28 + 1;
              } while (pOVar28 != pOVar8);
              lVar19 = (ulong)(uint)(iVar22 << 4) - 0x10;
              auVar25 = auStack_78;
              pcVar24 = local_80;
            }
          }
        }
        pcVar24 = pcVar24 + 0x20;
        auVar25 = (undefined1  [8])
                  nodes.
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (pcVar24 != pcVar16);
    }
    if ((auStack_78 == auVar25) ||
       (peVar7 = ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_78)->_M_ptr,
       peVar7->type == Unknown)) {
      pTVar5 = *first._M_current;
      auStack_58 = (undefined1  [8])
                   &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      peStack_98 = (element_type *)0x13;
      auStack_58 = (undefined1  [8])
                   std::__cxx11::string::_M_create
                             ((ulong *)auStack_58,(ulong)&stack0xffffffffffffff68);
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_98;
      ((element_type *)auStack_58)->type = 'e';
      ((element_type *)auStack_58)->field_0x1 = 'x';
      ((element_type *)auStack_58)->field_0x2 = 'p';
      ((element_type *)auStack_58)->field_0x3 = 'e';
      ((element_type *)auStack_58)->field_0x4 = 'c';
      ((element_type *)auStack_58)->field_0x5 = 't';
      ((element_type *)auStack_58)->field_0x6 = 'e';
      ((element_type *)auStack_58)->field_0x7 = 'd';
      (((element_type *)auStack_58)->line).
      super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x7373657270786520;
      *(undefined4 *)
       ((long)&(((element_type *)auStack_58)->line).
               super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 7) = 0x6e6f6973
      ;
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_98;
      (&peStack_98->type)[(long)&((element_type *)auStack_58)->type] = Unknown;
      peStack_98 = (element_type *)0x0;
      __dnew = 0;
      local_88 = (pointer)0x0;
      ParserContext::errorAtToken
                (ct,Error,pTVar5,(string *)auStack_58,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffff68);
    }
    else {
      if ((long)auVar25 - (long)auStack_78 == 0x10) {
        *(element_type **)this = peVar7;
        p_Var9 = (((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_78)->
                 _M_refcount)._M_pi;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var9;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          }
        }
        goto LAB_0019d144;
      }
      peVar7 = (((shared_ptr<chatra::Node> *)((long)auStack_78 + 0x10))->
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      ppTVar10 = (peVar7->tokens).
                 super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppTVar10 ==
          (peVar7->tokens).
          super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pTVar5 = *first._M_current;
        auStack_58 = (undefined1  [8])
                     &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        peStack_98 = (element_type *)0x30;
        auStack_58 = (undefined1  [8])
                     std::__cxx11::string::_M_create
                               ((ulong *)auStack_58,(ulong)&stack0xffffffffffffff68);
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_98;
        (((element_type *)auStack_58)->tokens).
        super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x6874206d6f726620;
        (((element_type *)auStack_58)->tokens).
        super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x6e656b6f74207369;
        (((element_type *)auStack_58)->line).
        super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6f69737365727078;
        (((element_type *)auStack_58)->tokens).
        super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x737472617473206e;
        ((element_type *)auStack_58)->type = 'e';
        ((element_type *)auStack_58)->field_0x1 = 'x';
        ((element_type *)auStack_58)->field_0x2 = 't';
        ((element_type *)auStack_58)->field_0x3 = 'r';
        ((element_type *)auStack_58)->field_0x4 = 'a';
        ((element_type *)auStack_58)->field_0x5 = ' ';
        ((element_type *)auStack_58)->field_0x6 = 't';
        ((element_type *)auStack_58)->field_0x7 = 'o';
        (((element_type *)auStack_58)->line).
        super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x65206e69206e656b;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_98;
        (&peStack_98->type)[(long)&((element_type *)auStack_58)->type] = Unknown;
        peStack_98 = (element_type *)0x0;
        __dnew = 0;
        local_88 = (pointer)0x0;
        ParserContext::errorAtToken
                  (ct,Error,pTVar5,(string *)auStack_58,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffff68);
      }
      else {
        pTVar5 = *ppTVar10;
        auStack_58 = (undefined1  [8])
                     &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        peStack_98 = (element_type *)0x19;
        auStack_58 = (undefined1  [8])
                     std::__cxx11::string::_M_create
                               ((ulong *)auStack_58,(ulong)&stack0xffffffffffffff68);
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_98;
        builtin_strncpy((char *)((long)&(((element_type *)auStack_58)->line).
                                        super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 1),"en in ex",8);
        builtin_strncpy((char *)((long)&(((element_type *)auStack_58)->line).
                                        super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi + 1),"pression",8);
        ((element_type *)auStack_58)->type = 'e';
        ((element_type *)auStack_58)->field_0x1 = 'x';
        ((element_type *)auStack_58)->field_0x2 = 't';
        ((element_type *)auStack_58)->field_0x3 = 'r';
        ((element_type *)auStack_58)->field_0x4 = 'a';
        ((element_type *)auStack_58)->field_0x5 = ' ';
        ((element_type *)auStack_58)->field_0x6 = 't';
        ((element_type *)auStack_58)->field_0x7 = 'o';
        (((element_type *)auStack_58)->line).
        super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x65206e69206e656b;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_98;
        (&peStack_98->type)[(long)&((element_type *)auStack_58)->type] = Unknown;
        peStack_98 = (element_type *)0x0;
        __dnew = 0;
        local_88 = (pointer)0x0;
        ParserContext::errorAtToken
                  (ct,Error,pTVar5,(string *)auStack_58,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffff68);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff68);
    if (auStack_58 !=
        (undefined1  [8])&n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ) {
      operator_delete((void *)auStack_58);
    }
  }
  createNullNode(this,*first._M_current);
LAB_0019d144:
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_78);
  sVar29.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar29.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = extraout_RAX;
  return (shared_ptr<chatra::Node>)
         sVar29.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> parseExpression(ParserContext& ct, TokenPtrIterator first, TokenPtrIterator last) {

	auto nodes = parseNodes(ct, first, last);
	if (nodes.empty())
		return createNullNode(**first);

	// Simple but may inefficient bottom-up parsing
	// TODO rewrite
	for (auto& group : opPatterns) {
		if (group.leftToRight) {
			for (auto it = nodes.begin(); it != nodes.end(); ) {
				bool matched = false;
				for (auto& pattern : group.patterns) {
					if (static_cast<size_t>(std::distance(it, nodes.end())) < pattern.elements.size())
						continue;
					auto n = extractOperator(nodes.begin(), it, pattern);
					if (!n)
						continue;
					it = nodes.erase(it, it + pattern.elements.size());
					it = nodes.insert(it, n);
					matched = true;
				}
				if (!matched)
					it++;
			}
		}
		else {
			for (auto it = nodes.end(); it != nodes.begin(); ) {
				bool matched = false;
				for (auto& pattern : group.patterns) {
					if (static_cast<size_t>(std::distance(nodes.begin(), it)) < pattern.elements.size())
						continue;
					auto n = extractOperator(nodes.begin(), it - pattern.elements.size(), pattern);
					if (!n)
						continue;
					it = nodes.erase(it - pattern.elements.size(), it);
					it = nodes.insert(it, n) + 1;
					matched = true;
				}
				if (!matched)
					it--;
			}
		}
	}

	if (nodes.empty() || nodes[0]->type == NodeType::Unknown) {
		ct.errorAtToken(ErrorLevel::Error, **first, "expected expression", {});
		return createNullNode(**first);
	}

	if (nodes.size() != 1) {
		if (!nodes[1]->tokens.empty())
			ct.errorAtToken(ErrorLevel::Error, *nodes[1]->tokens[0], "extra token in expression", {});
		else
			ct.errorAtToken(ErrorLevel::Error, **first, "extra token in expression starts from this token", {});
		return createNullNode(**first);
	}

	return nodes[0];
}